

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void DeserializeHDKeypath<DataStream>(DataStream *s,KeyOriginInfo *hd_keypath)

{
  uint64_t length;
  long in_FS_OFFSET;
  KeyOriginInfo local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  length = ReadCompactSize<DataStream>(s,true);
  DeserializeKeyOrigin<DataStream>(&local_40,s,length);
  KeyOriginInfo::operator=(hd_keypath,&local_40);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&local_40.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DeserializeHDKeypath(Stream& s, KeyOriginInfo& hd_keypath)
{
    hd_keypath = DeserializeKeyOrigin(s, ReadCompactSize(s));
}